

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

StringRef __thiscall llvm::AArch64::getArchExtFeature(AArch64 *this,StringRef ArchExt)

{
  char *__n;
  int iVar1;
  size_t sVar2;
  long lVar3;
  char *__n_00;
  char *__s;
  StringRef SVar4;
  
  __n_00 = ArchExt.Data;
  if (((char *)0x1 < __n_00) && (*(short *)this == 0x6f6e)) {
    __n = __n_00 + -2;
    lVar3 = 0;
    do {
      __s = *(char **)((long)&DAT_002537a0 + lVar3);
      if ((__s != (char *)0x0) && (__n == *(char **)((long)&DAT_00253788 + lVar3))) {
        if (__n == (char *)0x0) goto LAB_001c856b;
        iVar1 = bcmp(this + 2,*(void **)((long)&(anonymous_namespace)::AArch64ARCHExtNames + lVar3),
                     (size_t)__n);
        if (iVar1 == 0) goto LAB_001c856b;
      }
      lVar3 = lVar3 + 0x28;
    } while (lVar3 != 0x2d0);
  }
  sVar2 = 0;
  lVar3 = 0;
  do {
    __s = *(char **)((long)&DAT_00253798 + lVar3);
    if ((__s != (char *)0x0) && (*(char **)((long)&DAT_00253788 + lVar3) == __n_00)) {
      if (__n_00 == (char *)0x0) goto LAB_001c856b;
      iVar1 = bcmp(this,*(void **)((long)&(anonymous_namespace)::AArch64ARCHExtNames + lVar3),
                   (size_t)__n_00);
      if (iVar1 == 0) goto LAB_001c856b;
    }
    lVar3 = lVar3 + 0x28;
  } while (lVar3 != 0x2d0);
  __s = (char *)0x0;
LAB_001c8576:
  SVar4.Length = sVar2;
  SVar4.Data = __s;
  return SVar4;
LAB_001c856b:
  sVar2 = strlen(__s);
  goto LAB_001c8576;
}

Assistant:

StringRef llvm::AArch64::getArchExtFeature(StringRef ArchExt) {
  if (ArchExt.startswith("no")) {
    StringRef ArchExtBase(ArchExt.substr(2));
    for (const auto &AE : AArch64ARCHExtNames) {
      if (AE.NegFeature && ArchExtBase == AE.getName())
        return StringRef(AE.NegFeature);
    }
  }

  for (const auto &AE : AArch64ARCHExtNames)
    if (AE.Feature && ArchExt == AE.getName())
      return StringRef(AE.Feature);
  return StringRef();
}